

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
DoSetSuperProperty_NoFastPath<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  ushort uVar1;
  FunctionBody *functionBody;
  bool bVar2;
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var newValue;
  Var thisInstance;
  ConstructorCache *pCVar3;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  inlineCache = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  functionBody = *(FunctionBody **)(this + 0x88);
  uVar1 = playout->PropertyIdIndex;
  propertyId = GetPropertyIdFromCacheId(this,(uint)uVar1);
  newValue = GetReg<unsigned_short>(this,playout->Value);
  thisInstance = GetReg<unsigned_short>(this,playout->Value2);
  JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath<false,Js::InlineCache>
            (functionBody,inlineCache,(uint)uVar1,instance,propertyId,newValue,thisInstance,flags);
  bVar2 = TaggedNumber::Is(instance);
  if (!bVar2) {
    pCVar3 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
    if ((pCVar3->content).updateAfterCtor == true) {
      InlineCache::RemoveFromInvalidationListAndClear
                (inlineCache,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
    }
  }
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoSetSuperProperty_NoFastPath(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        InlineCache *const inlineCache = GetInlineCache(playout->PropertyIdIndex);

        JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath<false, InlineCache>(
            GetFunctionBody(),
            inlineCache,
            playout->PropertyIdIndex,
            instance,
            GetPropertyIdFromCacheId(playout->PropertyIdIndex),
            GetReg(playout->Value),
            GetReg(playout->Value2),
            flags);

        if (!TaggedNumber::Is(instance) && GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
        {
            // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
            // function object's constructor cache will be updated with the type produced by the constructor. From that
            // point on, when the same function object is used as a constructor, the a new object with the final type will
            // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
            // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
            inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
        }
    }